

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O1

int __thiscall
TPZSFMatrix<long_double>::Subst_Diag(TPZSFMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  int iVar6;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  int iVar7;
  longdouble *plVar8;
  long lVar9;
  long lVar10;
  longdouble in_ST0;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble local_48;
  
  lVar10 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar7 = 0;
  if ((lVar10 == CONCAT44(extraout_var,iVar6)) &&
     ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed != '\0')) {
    plVar8 = this->fElem;
    iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    iVar7 = 1;
    if (CONCAT44(extraout_var_00,iVar6) != 0 && -1 < extraout_var_00) {
      lVar10 = 0;
      do {
        if (0 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) {
          lVar9 = 0;
          lVar11 = in_ST0;
          lVar1 = in_ST1;
          lVar2 = in_ST2;
          lVar3 = in_ST3;
          lVar4 = in_ST4;
          lVar5 = in_ST5;
          do {
            in_ST5 = in_ST6;
            in_ST4 = lVar5;
            in_ST3 = lVar4;
            in_ST2 = lVar3;
            in_ST1 = lVar2;
            in_ST0 = lVar1;
            (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(B,lVar10,lVar9);
            local_48 = lVar11 / *plVar8;
            in_ST6 = in_ST5;
            (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar10,lVar9,&local_48);
            lVar9 = lVar9 + 1;
            lVar11 = in_ST0;
            lVar1 = in_ST1;
            lVar2 = in_ST2;
            lVar3 = in_ST3;
            lVar4 = in_ST4;
            lVar5 = in_ST5;
          } while (lVar9 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol);
        }
        plVar8 = plVar8 + lVar10 + 2;
        lVar10 = lVar10 + 1;
        iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0xc])(this);
      } while (lVar10 < CONCAT44(extraout_var_01,iVar6));
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int
TPZSFMatrix<TVar> ::Subst_Diag( TPZFMatrix<TVar>  *B ) const
{
	if ( (B->Rows() != this->Dim()) || !this->fDecomposed )
		return( 0 );
	
	TVar *pDiag = fElem;
	for ( int64_t k = 0; k < this->Dim(); k++ )
    {
		for ( int64_t j = 0; j < B->Cols(); j++ )
			B->PutVal( k, j, B->GetVal( k, j ) / *pDiag );
		pDiag += (k + 2);
    }
	
	return( 1 );
}